

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void ecs_init_system(ecs_world_t *world,ecs_entity_t system,ecs_iter_action_t action,
                    ecs_query_t *query,void *ctx)

{
  _Bool _Var1;
  int32_t iVar2;
  EcsSystem *system_data;
  void *pvVar3;
  char *pcVar4;
  ecs_sig_column_t *columns;
  int32_t count;
  int32_t i;
  EcsSystem *sptr;
  void *pvStack_30;
  _Bool is_added;
  void *ctx_local;
  ecs_query_t *query_local;
  ecs_iter_action_t action_local;
  ecs_entity_t system_local;
  ecs_world_t *world_local;
  
  pvStack_30 = ctx;
  ctx_local = query;
  query_local = (ecs_query_t *)action;
  action_local = (ecs_iter_action_t)system;
  system_local = (ecs_entity_t)world;
  _ecs_assert((_Bool)((world->in_progress ^ 0xffU) & 1),0x19,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xe8);
  if ((*(byte *)(system_local + 0x5c91) & 1) != 0) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xe8,
                  "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                 );
  }
  sptr._7_1_ = 0;
  system_data = (EcsSystem *)
                ecs_get_mut_w_entity
                          ((ecs_world_t *)system_local,(ecs_entity_t)action_local,5,
                           (_Bool *)((long)&sptr + 7));
  _ecs_assert(system_data != (EcsSystem *)0x0,0xc,(char *)0x0,"sptr != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xed);
  if (system_data != (EcsSystem *)0x0) {
    if ((sptr._7_1_ & 1) == 0) {
      _ecs_assert(system_data->query == (ecs_query_t *)ctx_local,2,(char *)0x0,
                  "sptr->query == query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xf0);
      if (system_data->query != (ecs_query_t *)ctx_local) {
        __assert_fail("sptr->query == query",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0xf0,
                      "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                     );
      }
    }
    else {
      memset(system_data,0,0x50);
      system_data->query = (ecs_query_t *)ctx_local;
      system_data->entity = (ecs_entity_t)action_local;
      system_data->tick_source = 0;
      system_data->time_spent = 0.0;
    }
    system_data->action = (ecs_iter_action_t)query_local;
    system_data->ctx = pvStack_30;
    if ((sptr._7_1_ & 1) != 0) {
      iVar2 = ecs_vector_count(*(ecs_vector_t **)((long)ctx_local + 0x20));
      if (iVar2 == 0) {
        ecs_add_entity((ecs_world_t *)system_local,(ecs_entity_t)action_local,0x105);
      }
      else {
        ecs_system_activate((ecs_world_t *)system_local,(ecs_entity_t)action_local,true,system_data)
        ;
      }
      activate_in_columns((ecs_world_t *)system_local,(ecs_query_t *)ctx_local,
                          *(ecs_map_t **)(system_local + 0x5ae8),true);
      _Var1 = ecs_sig_check_constraints((ecs_world_t *)system_local,(ecs_sig_t *)ctx_local);
      if (!_Var1) {
        ecs_add_entity((ecs_world_t *)system_local,(ecs_entity_t)action_local,0x104);
      }
      _Var1 = ecs_has_entity((ecs_world_t *)system_local,(ecs_entity_t)action_local,0x106);
      if (_Var1) {
        register_out_columns((ecs_world_t *)system_local,(ecs_entity_t)action_local,system_data);
        _ecs_assert(system_data->on_demand != (ecs_on_demand_out_t *)0x0,0xc,(char *)0x0,
                    "sptr->on_demand != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0x118);
        if (system_data->on_demand == (ecs_on_demand_out_t *)0x0) {
          __assert_fail("sptr->on_demand != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                        ,0x118,
                        "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                       );
        }
        if (system_data->on_demand->count == 0) {
          ecs_add_entity((ecs_world_t *)system_local,(ecs_entity_t)action_local,0x104);
        }
      }
      iVar2 = ecs_vector_count(*(ecs_vector_t **)((long)ctx_local + 0x10));
      pvVar3 = _ecs_vector_first(*(ecs_vector_t **)((long)ctx_local + 0x10),0x28,0x10);
      columns._4_4_ = 0;
      while ((columns._4_4_ < iVar2 &&
             (*(int *)((long)pvVar3 + (long)columns._4_4_ * 0x28 + 8) == 1))) {
        columns._4_4_ = columns._4_4_ + 1;
      }
    }
    pcVar4 = ecs_get_name((ecs_world_t *)system_local,(ecs_entity_t)action_local);
    _ecs_trace(1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
               ,0x12e,"system #[green]%s#[reset] created with #[red]%s",pcVar4,
               *(undefined8 *)((long)ctx_local + 8));
    return;
  }
  __assert_fail("sptr != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0xed,
                "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
               );
}

Assistant:

static
void ecs_init_system(
    ecs_world_t *world,
    ecs_entity_t system,
    ecs_iter_action_t action,
    ecs_query_t *query,
    void *ctx)
{
    ecs_assert(!world->in_progress, ECS_INVALID_WHILE_ITERATING, NULL);

    /* Add & initialize the EcsSystem component */
    bool is_added = false;
    EcsSystem *sptr = ecs_get_mut(world, system, EcsSystem, &is_added);
    ecs_assert(sptr != NULL, ECS_INTERNAL_ERROR, NULL);

    if (!is_added) {
        ecs_assert(sptr->query == query, ECS_INVALID_PARAMETER, NULL);
    } else {
        memset(sptr, 0, sizeof(EcsSystem));
        sptr->query = query;
        sptr->entity = system;
        sptr->tick_source = 0;
        sptr->time_spent = 0;
    }

    /* Sanity check to make sure creating the query didn't add any additional
     * tags or components to the system */
    sptr->action = action;
    sptr->ctx = ctx;

    /* Only run this code when the system is created for the first time */
    if (is_added) {
        /* If tables have been matched with this system it is active, and we
         * should activate the in-columns, if any. This will ensure that any
         * OnDemand systems get enabled. */
        if (ecs_vector_count(query->tables)) {
            ecs_system_activate(world, system, true, sptr);
        } else {
            /* If system isn't matched with any tables, mark it as inactive. This
             * causes it to be ignored by the main loop. When the system matches
             * with a table it will be activated. */
            ecs_add_entity(world, system, EcsInactive);
        }

        /* If system is enabled, trigger enable components */
        activate_in_columns(world, query, world->on_enable_components, true);

        /* Check if all non-table column constraints are met. If not, disable
         * system (system will be enabled once constraints are met) */
        if (!ecs_sig_check_constraints(world, &query->sig)) {
            ecs_add_entity(world, system, EcsDisabledIntern);
        }

        /* If the query has a OnDemand system tag, register its [out] columns */
        if (ecs_has_entity(world, system, EcsOnDemand)) {
            register_out_columns(world, system, sptr);
            ecs_assert(sptr->on_demand != NULL, ECS_INTERNAL_ERROR, NULL);

            /* If there are no systems currently interested in any of the [out]
             * columns of the on demand system, disable it */
            if (!sptr->on_demand->count) {
                ecs_add_entity(world, system, EcsDisabledIntern);
            }        
        }

        /* Check if system has out columns */
        int32_t i, count = ecs_vector_count(query->sig.columns);
        ecs_sig_column_t *columns = ecs_vector_first(
                query->sig.columns, ecs_sig_column_t);
        
        for (i = 0; i < count; i ++) {
            if (columns[i].inout_kind != EcsIn) {
                break;
            }
        }
    }

    ecs_trace_1("system #[green]%s#[reset] created with #[red]%s", 
        ecs_get_name(world, system), query->sig.expr);
}